

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,Byte **bufOut)

{
  byte bVar1;
  byte *pbVar2;
  ELzmaDummy EVar3;
  uint symbol;
  uint uVar4;
  uint uVar5;
  int iVar6;
  SizeT SVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  CLzmaProb *pCVar12;
  uint uVar13;
  uint uVar14;
  UInt32 UVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  
  uVar8 = p->range;
  UVar15 = p->code;
  pbVar2 = *bufOut;
  pCVar12 = p->probs_1664;
  uVar14 = p->state;
  uVar16 = p->processedPos;
  uVar5 = (~(-1 << ((p->prop).pb & 0x1f)) & uVar16) * 0x10;
  if (uVar8 < 0x1000000) {
    if (buf < pbVar2) {
      uVar8 = uVar8 << 8;
      bVar1 = *buf;
      buf = buf + 1;
      UVar15 = UVar15 << 8 | (uint)bVar1;
      goto LAB_0012a2c3;
    }
    goto LAB_0012a856;
  }
LAB_0012a2c3:
  uVar13 = (uVar8 >> 0xb) * (uint)pCVar12[(ulong)(uVar5 + uVar14) - 0x100];
  uVar4 = UVar15 - uVar13;
  if (UVar15 < uVar13) {
    pCVar12 = pCVar12 + 0x140;
    if (p->checkDicSize != 0 || uVar16 != 0) {
      bVar1 = (p->prop).lc;
      SVar7 = p->dicPos;
      if (SVar7 == 0) {
        SVar7 = p->dicBufSize;
      }
      pCVar12 = pCVar12 + ((uint)(p->dic[SVar7 - 1] >> (8 - bVar1 & 0x1f)) +
                          ((uVar16 & ~(-1 << ((p->prop).lp & 0x1f))) << (bVar1 & 0x1f))) * 0x300;
    }
    if (uVar14 < 7) {
      EVar3 = DUMMY_LIT;
      uVar8 = 1;
      do {
        if (uVar13 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0012a856;
          uVar13 = uVar13 << 8;
          bVar1 = *buf;
          buf = buf + 1;
          UVar15 = UVar15 << 8 | (uint)bVar1;
        }
        uVar14 = (uVar13 >> 0xb) * (uint)pCVar12[uVar8];
        if (UVar15 < uVar14) {
          uVar8 = uVar8 * 2;
          uVar13 = uVar14;
        }
        else {
          uVar13 = uVar13 - uVar14;
          uVar8 = uVar8 * 2 + 1;
          UVar15 = UVar15 - uVar14;
        }
      } while (uVar8 < 0x100);
    }
    else {
      if (p->dicPos < (ulong)p->reps[0]) {
        SVar7 = p->dicBufSize;
      }
      else {
        SVar7 = 0;
      }
      uVar14 = (uint)p->dic[SVar7 + (p->dicPos - (ulong)p->reps[0])];
      EVar3 = DUMMY_LIT;
      uVar16 = 0x100;
      uVar8 = 1;
      do {
        uVar14 = uVar14 * 2;
        uVar4 = uVar16 & uVar14;
        uVar5 = uVar13;
        if (uVar13 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0012a856;
          uVar5 = uVar13 << 8;
          bVar1 = *buf;
          buf = buf + 1;
          UVar15 = UVar15 << 8 | (uint)bVar1;
        }
        uVar13 = (uVar5 >> 0xb) * (uint)pCVar12[uVar16 + uVar8 + uVar4];
        uVar10 = UVar15 - uVar13;
        if (UVar15 < uVar13) {
          uVar8 = uVar8 * 2;
          uVar16 = uVar4 ^ uVar16;
        }
        else {
          uVar13 = uVar5 - uVar13;
          uVar8 = uVar8 * 2 + 1;
          UVar15 = uVar10;
          uVar16 = uVar4;
        }
      } while (uVar8 < 0x100);
    }
LAB_0012a840:
    if (uVar13 < 0x1000000) {
      if (pbVar2 <= buf) goto LAB_0012a856;
      buf = buf + 1;
    }
    *bufOut = buf;
  }
  else {
    uVar8 = uVar8 - uVar13;
    if (uVar8 < 0x1000000) {
      if (pbVar2 <= buf) goto LAB_0012a856;
      uVar8 = uVar8 * 0x100;
      bVar1 = *buf;
      buf = buf + 1;
      uVar4 = uVar4 * 0x100 | (uint)bVar1;
    }
    uVar16 = (uVar8 >> 0xb) * (uint)pCVar12[(ulong)uVar14 + 0x10];
    uVar10 = uVar4 - uVar16;
    if (uVar4 < uVar16) {
      EVar3 = DUMMY_MATCH;
      lVar19 = -0x600;
      uVar18 = uVar16;
      uVar11 = uVar4;
LAB_0012a3e7:
      if (uVar18 < 0x1000000) {
        if (pbVar2 <= buf) goto LAB_0012a856;
        uVar18 = uVar18 << 8;
        bVar1 = *buf;
        buf = buf + 1;
        uVar11 = uVar11 << 8 | (uint)bVar1;
      }
      uVar13 = (uVar18 >> 0xb) * (uint)*(ushort *)((long)pCVar12 + lVar19);
      uVar14 = 8;
      uVar8 = uVar11 - uVar13;
      if (uVar11 < uVar13) {
        lVar19 = (long)pCVar12 + (ulong)uVar5 * 2 + lVar19;
        iVar9 = 0;
      }
      else {
        uVar18 = uVar18 - uVar13;
        if (uVar18 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0012a856;
          uVar18 = uVar18 * 0x100;
          bVar1 = *buf;
          buf = buf + 1;
          uVar8 = (uint)bVar1 | uVar8 * 0x100;
        }
        uVar13 = (uVar18 >> 0xb) * (uint)*(ushort *)((long)pCVar12 + lVar19 + 0x10);
        uVar11 = uVar8 - uVar13;
        if (uVar8 < uVar13) {
          lVar19 = (long)pCVar12 + (ulong)uVar5 * 2 + lVar19 + 0x10;
          iVar9 = 8;
          uVar11 = uVar8;
        }
        else {
          uVar13 = uVar18 - uVar13;
          lVar19 = (long)pCVar12 + lVar19 + 0x200;
          iVar9 = 0x10;
          uVar14 = 0x100;
        }
      }
      uVar20 = 1;
      do {
        uVar8 = uVar13;
        if (uVar13 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0012a856;
          uVar8 = uVar13 << 8;
          bVar1 = *buf;
          buf = buf + 1;
          uVar11 = uVar11 << 8 | (uint)bVar1;
        }
        uVar13 = (uVar8 >> 0xb) * (uint)*(ushort *)(lVar19 + uVar20 * 2);
        uVar5 = uVar11 - uVar13;
        if (uVar11 < uVar13) {
          uVar8 = (int)uVar20 * 2;
        }
        else {
          uVar13 = uVar8 - uVar13;
          uVar8 = (int)uVar20 * 2 + 1;
          uVar11 = uVar5;
        }
        uVar20 = (ulong)uVar8;
      } while (uVar8 < uVar14);
      if (uVar4 < uVar16) {
        uVar8 = (iVar9 - uVar14) + uVar8;
        uVar14 = 3;
        if (uVar8 < 3) {
          uVar14 = uVar8;
        }
        uVar20 = 1;
        do {
          uVar8 = uVar13;
          if (uVar13 < 0x1000000) {
            if (pbVar2 <= buf) goto LAB_0012a856;
            uVar8 = uVar13 << 8;
            bVar1 = *buf;
            buf = buf + 1;
            uVar11 = uVar11 << 8 | (uint)bVar1;
          }
          uVar13 = (uVar8 >> 0xb) *
                   (uint)*(ushort *)((long)pCVar12 + uVar20 * 2 + (ulong)(uVar14 << 7) + 0x80);
          uVar16 = uVar11 - uVar13;
          if (uVar11 < uVar13) {
            uVar8 = (int)uVar20 * 2;
          }
          else {
            uVar13 = uVar8 - uVar13;
            uVar8 = (int)uVar20 * 2 + 1;
            uVar11 = uVar16;
          }
          uVar20 = (ulong)uVar8;
        } while (uVar8 < 0x40);
        uVar14 = uVar8 - 0x40;
        if (3 < uVar14) {
          if (uVar14 < 0xe) {
            iVar9 = (uVar14 >> 1) - 1;
            pCVar12 = pCVar12 + ((ulong)((uVar8 & 1 | 2) << ((byte)iVar9 & 0x1f)) - 0x680);
          }
          else {
            iVar17 = (uVar14 >> 1) - 5;
            iVar9 = 4;
            do {
              if (uVar13 < 0x1000000) {
                if (pbVar2 <= buf) goto LAB_0012a856;
                uVar13 = uVar13 << 8;
                bVar1 = *buf;
                buf = buf + 1;
                uVar11 = uVar11 << 8 | (uint)bVar1;
              }
              uVar13 = uVar13 >> 1;
              uVar8 = 0;
              if (-1 < (int)(uVar11 - uVar13)) {
                uVar8 = uVar13;
              }
              uVar11 = uVar11 - uVar8;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          uVar8 = 1;
          iVar17 = 1;
          do {
            uVar14 = uVar13;
            if (uVar13 < 0x1000000) {
              if (pbVar2 <= buf) goto LAB_0012a856;
              uVar14 = uVar13 << 8;
              bVar1 = *buf;
              buf = buf + 1;
              uVar11 = uVar11 << 8 | (uint)bVar1;
            }
            uVar13 = (uVar14 >> 0xb) * (uint)pCVar12[uVar8];
            uVar16 = uVar11 - uVar13;
            iVar6 = iVar17;
            if (uVar13 <= uVar11) {
              uVar13 = uVar14 - uVar13;
              iVar6 = iVar17 * 2;
              uVar11 = uVar16;
            }
            iVar17 = iVar17 * 2;
            uVar8 = uVar8 + iVar6;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
      }
      goto LAB_0012a840;
    }
    uVar8 = uVar8 - uVar16;
    if (uVar8 < 0x1000000) {
      if (pbVar2 <= buf) goto LAB_0012a856;
      uVar8 = uVar8 * 0x100;
      bVar1 = *buf;
      buf = buf + 1;
      uVar10 = uVar10 * 0x100 | (uint)bVar1;
    }
    uVar18 = (uVar8 >> 0xb) * (uint)pCVar12[(ulong)uVar14 + 0x1c];
    uVar11 = uVar10 - uVar18;
    if (uVar18 <= uVar10) {
      uVar8 = uVar8 - uVar18;
      if (uVar8 < 0x1000000) {
        if (pbVar2 <= buf) goto LAB_0012a856;
        uVar8 = uVar8 * 0x100;
        bVar1 = *buf;
        buf = buf + 1;
        uVar11 = uVar11 * 0x100 | (uint)bVar1;
      }
      EVar3 = DUMMY_REP;
      uVar18 = (uVar8 >> 0xb) * (uint)pCVar12[(ulong)uVar14 + 0x28];
      lVar19 = -0xa00;
      uVar13 = uVar11 - uVar18;
      if (uVar18 <= uVar11) {
        uVar8 = uVar8 - uVar18;
        if (uVar8 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0012a856;
          uVar8 = uVar8 * 0x100;
          bVar1 = *buf;
          buf = buf + 1;
          uVar13 = uVar13 * 0x100 | (uint)bVar1;
        }
        uVar18 = (uVar8 >> 0xb) * (uint)pCVar12[(ulong)uVar14 + 0x34];
        uVar14 = uVar13 - uVar18;
        uVar11 = uVar13;
        if (uVar18 <= uVar13) {
          uVar18 = uVar8 - uVar18;
          uVar11 = uVar14;
        }
      }
      goto LAB_0012a3e7;
    }
    if (0xffffff < uVar18) {
LAB_0012a4c7:
      uVar13 = (uVar18 >> 0xb) * (uint)pCVar12[(ulong)(uVar5 + uVar14) - 0x600];
      if (uVar10 < uVar13) {
        EVar3 = DUMMY_REP;
        goto LAB_0012a840;
      }
      uVar18 = uVar18 - uVar13;
      EVar3 = DUMMY_REP;
      lVar19 = -0xa00;
      uVar11 = uVar10 - uVar13;
      goto LAB_0012a3e7;
    }
    if (buf < pbVar2) {
      uVar18 = uVar18 * 0x100;
      bVar1 = *buf;
      buf = buf + 1;
      uVar10 = uVar10 << 8 | (uint)bVar1;
      goto LAB_0012a4c7;
    }
LAB_0012a856:
    EVar3 = DUMMY_INPUT_EOF;
  }
  return EVar3;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, const Byte **bufOut)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = *bufOut;
  const CLzmaProb *probs = GET_PROBS;
  unsigned state = (unsigned)p->state;
  ELzmaDummy res;

  for (;;)
  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = CALC_POS_STATE(p->processedPos, ((unsigned)1 << p->prop.pb) - 1);

    prob = probs + IsMatch + COMBINED_PS_STATE;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & (((unsigned)1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            ((unsigned)p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte += matchByte;
          bit = offs;
          offs &= matchByte;
          probLit = prob + (offs + bit + symbol);
          GET_BIT2_CHECK(probLit, symbol, offs ^= bit; , ; )
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK
          prob = probs + IsRep0Long + COMBINED_PS_STATE;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
            break;
          }
          else
          {
            UPDATE_1_CHECK
          }
        }
        else
        {
          UPDATE_1_CHECK
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
          }
          else
          {
            UPDATE_1_CHECK
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK
            }
            else
            {
              UPDATE_1_CHECK
            }
          }
        }
        state = kNumStates;
        prob = probs + RepLenCoder;
      }